

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

lws * lws_wsi_mqtt_adopt(lws *parent_wsi,lws *wsi)

{
  uint *puVar1;
  int iVar2;
  
  if ((parent_wsi->mux).child_count - 8 < 0xfffffff7) {
    wsi = (lws *)0x0;
    _lws_log(1,"%s: reached concurrent stream limit\n","lws_wsi_mqtt_adopt");
  }
  else {
    wsi->field_0x2e2 = wsi->field_0x2e2 | 0x80;
    lws_wsi_mux_insert(wsi,parent_wsi,(wsi->mux).my_sid);
    iVar2 = lws_ensure_user_space(wsi);
    if (iVar2 == 0) {
      lws_mqtt_set_client_established(wsi);
      lws_callback_on_writable(wsi);
    }
    else {
      (parent_wsi->mux).child_list = (wsi->mux).sibling_list;
      puVar1 = &(parent_wsi->mux).child_count;
      *puVar1 = *puVar1 - 1;
      if (wsi->user_space != (void *)0x0) {
        lws_realloc(wsi->user_space,0,"free");
        wsi->user_space = (void *)0x0;
      }
      (*wsi->protocol->callback)(wsi,LWS_CALLBACK_WSI_DESTROY,(void *)0x0,(void *)0x0,0);
      lws_realloc(wsi,0,"lws_free");
      wsi = (lws *)0x0;
    }
  }
  return wsi;
}

Assistant:

struct lws *
lws_wsi_mqtt_adopt(struct lws *parent_wsi, struct lws *wsi)
{
	/* no more children allowed by parent? */

	if (parent_wsi->mux.child_count + 1 > LWS_MQTT_MAX_CHILDREN) {
		lwsl_err("%s: reached concurrent stream limit\n", __func__);
		return NULL;
	}

#if defined(LWS_WITH_CLIENT)
	wsi->client_mux_substream = 1;
#endif

	lws_wsi_mux_insert(wsi, parent_wsi, wsi->mux.my_sid);

	if (lws_ensure_user_space(wsi))
		goto bail1;

	lws_mqtt_set_client_established(wsi);
	lws_callback_on_writable(wsi);

#if defined(LWS_WITH_SERVER_STATUS)
	wsi->vhost->conn_stats.mqtt_subs++;
#endif

	return wsi;

bail1:
	/* undo the insert */
	parent_wsi->mux.child_list = wsi->mux.sibling_list;
	parent_wsi->mux.child_count--;

	if (wsi->user_space)
		lws_free_set_NULL(wsi->user_space);

	wsi->protocol->callback(wsi, LWS_CALLBACK_WSI_DESTROY, NULL, NULL, 0);
	lws_free(wsi);

	return NULL;
}